

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O2

string * duckdb::PhysicalCopyToFile::GetNonTmpFile
                   (string *__return_storage_ptr__,ClientContext *context,string *tmp_file_path)

{
  FileSystem *this;
  long lVar1;
  string base;
  string path;
  string local_38 [32];
  
  this = FileSystem::GetFileSystem(context);
  StringUtil::GetFilePath((string *)&path,(string *)tmp_file_path);
  StringUtil::GetFileName((string *)&base,(string *)tmp_file_path);
  lVar1 = ::std::__cxx11::string::find((char *)&base,0x201f374);
  if (lVar1 == 0) {
    ::std::__cxx11::string::substr((ulong)local_38,(ulong)&base);
    ::std::__cxx11::string::operator=((string *)&base,local_38);
    ::std::__cxx11::string::~string(local_38);
  }
  FileSystem::JoinPath((string *)__return_storage_ptr__,this,(string *)&path,(string *)&base);
  ::std::__cxx11::string::~string((string *)&base);
  ::std::__cxx11::string::~string((string *)&path);
  return __return_storage_ptr__;
}

Assistant:

string PhysicalCopyToFile::GetNonTmpFile(ClientContext &context, const string &tmp_file_path) {
	auto &fs = FileSystem::GetFileSystem(context);

	auto path = StringUtil::GetFilePath(tmp_file_path);
	auto base = StringUtil::GetFileName(tmp_file_path);

	auto prefix = base.find("tmp_");
	if (prefix == 0) {
		base = base.substr(4);
	}

	return fs.JoinPath(path, base);
}